

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void memJoin(void *dest,void *src1,size_t count1,void *src2,size_t count2)

{
  undefined1 *__dest;
  long lVar1;
  undefined1 *__src;
  undefined1 *__dest_00;
  undefined1 *puVar2;
  undefined1 uVar3;
  size_t __n;
  size_t sVar4;
  undefined1 *__dest_01;
  size_t sVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  __dest = (undefined1 *)((long)dest + count2);
  __dest_01 = (undefined1 *)((long)dest + count1);
  sVar5 = 1 - count2;
  lVar1 = count2 + count1;
  lVar6 = 0;
  lVar7 = 0;
  while( true ) {
    __src = (undefined1 *)((long)src1 + lVar7);
    __dest_00 = (undefined1 *)((long)dest + lVar7);
    sVar4 = count2 + lVar6;
    __n = count1 + lVar6;
    if ((((__n == 0) || (sVar4 == 0)) || (__dest_01 <= src2)) ||
       ((undefined1 *)((long)src2 + lVar6 + count2) <= __dest_00)) break;
    puVar2 = (undefined1 *)((long)dest + lVar6 + lVar1);
    if ((puVar2 <= __src) || (__src <= __dest_00)) {
      memmove(__dest_01,src2,sVar4);
      src2 = __src;
      __dest_01 = __dest_00;
      goto LAB_00119892;
    }
    if ((__dest <= __src) || ((undefined1 *)((long)src1 + count1) <= __dest_00)) {
      memmove(__dest_00,src2,sVar4);
      memmove(__dest,__src,__n);
      while (bVar8 = sVar4 != 0, sVar4 = sVar4 - 1, bVar8) {
        uVar3 = *__dest_00;
        if (count1 != sVar5) {
          memmove(__dest_00,(void *)((long)dest + lVar7 + 1),count1 - sVar5);
        }
        *(undefined1 *)((long)dest + lVar6 + lVar1 + -1) = uVar3;
      }
      return;
    }
    if ((puVar2 <= src2) || (src2 <= __dest_00)) {
      memmove(__dest,__src,__n);
      sVar4 = count2 + lVar6;
      memmove(__dest_00,src2,sVar4);
      while (bVar8 = sVar4 != 0, sVar4 = sVar4 - 1, bVar8) {
        uVar3 = *__dest_00;
        if (count1 != sVar5) {
          memmove(__dest_00,(void *)((long)dest + lVar7 + 1),count1 - sVar5);
        }
        *(undefined1 *)((long)dest + lVar6 + lVar1 + -1) = uVar3;
      }
      return;
    }
    *__dest_00 = *__src;
    *(undefined1 *)((long)dest + lVar6 + lVar1 + -1) =
         *(undefined1 *)((long)src2 + lVar6 + (count2 - 1));
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + -1;
    sVar5 = sVar5 + 2;
  }
  if (__n != 0) {
    memmove(__dest_00,__src,__n);
  }
  if (sVar4 == 0) {
    return;
  }
  __n = count2 + lVar6;
LAB_00119892:
  memmove(__dest_01,src2,__n);
  return;
}

Assistant:

void memJoin(void* dest, const void* src1, size_t count1, const void* src2,
	size_t count2)
{
	register octet o;
	size_t i;
	ASSERT(memIsValid(src1, count1));
	ASSERT(memIsValid(src2, count2));
	ASSERT(memIsValid(dest, count1 + count2));
repeat:
	if (memIsDisjoint2(dest, count1, src2, count2))
	{
		memMove(dest, src1, count1);
		memMove((octet*)dest + count1, src2, count2);
	}
	else if (memIsDisjoint2((octet*)dest + count1, count2, src1, count1))
	{
		memMove((octet*)dest + count1, src2, count2);
		memMove(dest, src1, count1);
	}
	else if (memIsDisjoint2(dest, count2, src1, count1))
	{
		// dest <- src2 || src1
		memMove(dest, src2, count2);
		memMove((octet*)dest + count2, src1, count1);
		// dest <- dest <<< count2
		for (i = 0; i < count2; ++i)
		{
			o = ((octet*)dest)[0];
			memMove(dest, (octet*)dest + 1, count1 + count2 - 1);
			((octet*)dest)[count1 + count2 - 1] = o;
		}
	}
	else if (memIsDisjoint2((octet*)dest + count2, count1, src2, count2))
	{
		// dest <- src2 || src1
		memMove((octet*)dest + count2, src1, count1);
		memMove(dest, src2, count2);
		// dest <- dest <<< count2
		for (i = 0; i < count2; ++i)
		{
			o = ((octet*)dest)[0];
			memMove(dest, (octet*)dest + 1, count1 + count2 - 1);
			((octet*)dest)[count1 + count2 - 1] = o;
		}
	}
	else
	{
		// src1 (src2) пересекается и с префиксом, и с суффиксом dest
		// длины count2 (count1) => и первый, и последний октет dest
		// не входят не входят ни в src1, ни в src2
		((octet*)dest)[0] = ((const octet*)src1)[0];
		((octet*)dest)[count1 + count2 - 1] = ((const octet*)src2)[count2 - 1];
		VERIFY(count1--);
		VERIFY(count2--);
		src1 = (const octet*)src1 + 1;
		dest = (octet*)dest + 1;
		goto repeat;
	}
}